

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

bool slang::exactlyEqual(SVInt *lhs,SVInt *rhs)

{
  void *__s1;
  uint32_t uVar1;
  int iVar2;
  SVInt *in_RSI;
  undefined8 *in_RDI;
  bool bothSigned;
  logic_t *in_stack_ffffffffffffff80;
  uint64_t *__s2;
  SVInt *in_stack_ffffffffffffff90;
  SVInt *this;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  SVInt *in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  byte bVar3;
  SVInt local_50 [3];
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  bool local_1;
  
  if (((*(byte *)((long)in_RDI + 0xd) & 1) == 0) &&
     (((in_RSI->super_SVIntStorage).unknownFlag & 1U) == 0)) {
    SVInt::operator==((SVInt *)CONCAT17(in_stack_ffffffffffffffaf,
                                        CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8
                                                )),in_stack_ffffffffffffffa0);
    local_1 = logic_t::operator_cast_to_bool(in_stack_ffffffffffffff80);
  }
  else if (((*(byte *)((long)in_RDI + 0xd) & 1) == 0) ||
          (((in_RSI->super_SVIntStorage).unknownFlag & 1U) == 0)) {
    local_1 = false;
  }
  else if (*(bitwidth_t *)(in_RDI + 1) == (in_RSI->super_SVIntStorage).bitWidth) {
    __s1 = (void *)*in_RDI;
    __s2 = (in_RSI->super_SVIntStorage).field_0.pVal;
    uVar1 = SVInt::getNumWords((SVInt *)0x3feb9a);
    iVar2 = memcmp(__s1,__s2,(ulong)(uVar1 << 3));
    local_1 = iVar2 == 0;
  }
  else {
    bVar3 = 0;
    if ((*(byte *)((long)in_RDI + 0xc) & 1) != 0) {
      bVar3 = (in_RSI->super_SVIntStorage).signFlag;
    }
    bVar3 = bVar3 & 1;
    if (*(uint *)(in_RDI + 1) < (in_RSI->super_SVIntStorage).bitWidth) {
      SVInt::extend((SVInt *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                    (bitwidth_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                    SUB81((ulong)in_stack_ffffffffffffff90 >> 0x18,0));
      local_1 = exactlyEqual(in_RSI,(SVInt *)CONCAT17(in_stack_ffffffffffffffe7,
                                                      CONCAT16(bVar3,in_stack_ffffffffffffffe0)));
      SVInt::~SVInt(in_stack_ffffffffffffff90);
    }
    else {
      this = local_50;
      SVInt::extend((SVInt *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                    (bitwidth_t)((ulong)this >> 0x20),SUB81((ulong)this >> 0x18,0));
      local_1 = exactlyEqual(in_RSI,(SVInt *)CONCAT17(in_stack_ffffffffffffffe7,
                                                      CONCAT16(bVar3,in_stack_ffffffffffffffe0)));
      SVInt::~SVInt(this);
    }
  }
  return local_1;
}

Assistant:

bool exactlyEqual(const SVInt& lhs, const SVInt& rhs) {
    // if no unknown flags, do normal comparison
    if (!lhs.unknownFlag && !rhs.unknownFlag)
        return (bool)(lhs == rhs);

    // if one has unknown and the other doesn't, they're not equal
    if (!lhs.unknownFlag || !rhs.unknownFlag)
        return false;

    // handle sign extension if necessary
    if (lhs.bitWidth != rhs.bitWidth) {
        bool bothSigned = lhs.signFlag && rhs.signFlag;
        if (lhs.bitWidth < rhs.bitWidth)
            return exactlyEqual(lhs.extend(rhs.bitWidth, bothSigned), rhs);
        else
            return exactlyEqual(lhs, rhs.extend(lhs.bitWidth, bothSigned));
    }

    // ok, equal widths, and they both have unknown values, do a straight memory compare
    return memcmp(lhs.pVal, rhs.pVal, lhs.getNumWords() * SVInt::WORD_SIZE) == 0;
}